

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

phits_particle_t * phits_load_particle(phits_file_t ff)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  double *pdVar4;
  long in_RDI;
  phits_particle_t *pp;
  double *pdata;
  uint old_particlesize;
  int old_reclen;
  phits_fileinternal_t *f;
  undefined8 in_stack_ffffffffffffffd0;
  phits_fileinternal_t *in_stack_ffffffffffffffd8;
  long lVar5;
  phits_fileinternal_t *in_stack_fffffffffffffff8;
  phits_particle_t *ppVar6;
  
  if (*(int *)(in_RDI + 0x8c) == 0) {
    ppVar6 = (phits_particle_t *)0x0;
  }
  else {
    if (*(int *)(in_RDI + 0x108) == 0) {
      lVar5 = in_RDI;
      iVar1 = phits_ensure_load(in_stack_ffffffffffffffd8,
                                (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDI + 0x8c) = 0;
        return (phits_particle_t *)0x0;
      }
      iVar1 = *(int *)(in_RDI + 0x8c);
      iVar2 = phits_tryload_reclen(in_stack_fffffffffffffff8,(int)((ulong)lVar5 >> 0x20));
      if (iVar2 == 0) {
        phits_error((char *)0x102c96);
      }
      if (*(int *)(in_RDI + 0x8c) != iVar1) {
        phits_error((char *)0x102cb3);
      }
    }
    pdVar4 = (double *)(in_RDI + 0x90 + (long)*(int *)(in_RDI + 0x88));
    ppVar6 = (phits_particle_t *)(in_RDI + 0x18);
    *(long *)(in_RDI + 0x78) = (long)*pdVar4;
    ppVar6->x = pdVar4[1];
    *(double *)(in_RDI + 0x20) = pdVar4[2];
    *(double *)(in_RDI + 0x28) = pdVar4[3];
    *(double *)(in_RDI + 0x30) = pdVar4[4];
    *(double *)(in_RDI + 0x38) = pdVar4[5];
    *(double *)(in_RDI + 0x40) = pdVar4[6];
    *(double *)(in_RDI + 0x68) = pdVar4[7];
    *(double *)(in_RDI + 0x60) = pdVar4[8];
    *(double *)(in_RDI + 0x70) = pdVar4[9];
    if (*(int *)(in_RDI + 0x8c) == 0x68) {
      *(double *)(in_RDI + 0x48) = pdVar4[10];
      *(double *)(in_RDI + 0x50) = pdVar4[0xb];
      *(double *)(in_RDI + 0x58) = pdVar4[0xc];
    }
    else {
      *(undefined8 *)(in_RDI + 0x48) = 0;
      *(undefined8 *)(in_RDI + 0x50) = 0;
      *(undefined8 *)(in_RDI + 0x58) = 0;
    }
    iVar3 = conv_code_phits2pdg((int32_t)*(undefined8 *)(in_RDI + 0x78));
    ppVar6->pdgcode = (long)iVar3;
    *(undefined4 *)(in_RDI + 0x108) = 0;
  }
  return ppVar6;
}

Assistant:

const phits_particle_t * phits_load_particle(phits_file_t ff)
{
  phits_fileinternal_t * f = (phits_fileinternal_t *)ff.internal;
  assert(f);

  if (!f->particlesize) {
    //EOF already
    return 0;
  }

  assert( f->particlesize == 10*sizeof(double) || f->particlesize == 13*sizeof(double) );

  if (!f->lbuf) {
    if (!phits_ensure_load(f, 1)) {
      //Can't read a single byte - assume EOF:
      f->particlesize = 0;
      return 0;
    }
    //Try to load another record
    int old_reclen = f->reclen;
    (void)old_reclen;//otherwise unused if assert inactive.
    unsigned old_particlesize = f->particlesize;
    if (!phits_tryload_reclen(f,f->reclen)) {
      phits_error("Problems loading particle data record!");
      //return 0;
    }
    assert(f->reclen==old_reclen);
    if ( f->particlesize != old_particlesize) {
      phits_error("Problems loading particle data record - particle"
                  " data length changed mid-file (perhaps it is not"
                  " actually a binary PHITS dump file after all?)!");
      //return 0;
    }
  }

  assert( f->lbuf == f->particlesize + f->reclen * 2 );
  double * pdata = (double*)(f->buf+f->reclen);
  phits_particle_t * pp =  & (f->part);
  pp->rawtype = (long)pdata[0];
  //NB: PHITS units, not MCPL units here (only difference is time unit which is ns in PHITS and ms in MCPL):
  pp->x = pdata[1];//cm
  pp->y = pdata[2];//cm
  pp->z = pdata[3];//cm
  pp->dirx = pdata[4];
  pp->diry = pdata[5];
  pp->dirz = pdata[6];
  pp->ekin = pdata[7];//MeV
  pp->weight = pdata[8];
  pp->time = pdata[9];//ns
  if (f->particlesize == 13*sizeof(double)) {
    pp->polx = pdata[10];
    pp->poly = pdata[11];
    pp->polz = pdata[12];
  } else {
    pp->polx = 0.0;
    pp->poly = 0.0;
    pp->polz = 0.0;
  }

  pp->pdgcode = conv_code_phits2pdg(pp->rawtype);

  //Mark as used:
  f->lbuf = 0;

  return pp;
}